

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O0

void server::forcespectator_cmd(int cid,char **args,int argc)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  clientinfo *pcVar4;
  char *pcVar5;
  clientinfo *ci_1;
  clientinfo *ci;
  int cn;
  bool usage;
  int argc_local;
  char **args_local;
  int cid_local;
  
  bVar1 = false;
  bVar2 = QServ::getlastSA(&qs);
  if (bVar2) {
    ci._4_4_ = atoi(args[1]);
    if ((ci._4_4_ < 0) || (1000 < ci._4_4_)) {
      bVar1 = true;
      goto LAB_0018d79e;
    }
  }
  else {
    ci._4_4_ = QServ::getSender(&qs);
  }
  pcVar4 = QServ::getClient(&qs,ci._4_4_);
  if (pcVar4 == (clientinfo *)0x0) {
    iVar3 = QServ::getSender(&qs);
    sendf(iVar3,1,"ris",0x23,"\f3Error: Player not connected");
  }
  else if (((((pcVar4->connected & 1U) != 0) && (iVar3 = QServ::getSender(&qs), ci._4_4_ != iVar3))
           && (-1 < ci._4_4_)) &&
          (((ci._4_4_ < 0x3e9 && (pcVar4 != (clientinfo *)0x0)) &&
           (((pcVar4->connected & 1U) != 0 && (args[1] != (char *)0x0)))))) {
    pcVar4 = QServ::getClient(&qs,ci._4_4_);
    forcespectator(pcVar4);
  }
LAB_0018d79e:
  if (bVar1) {
    iVar3 = QServ::getSender(&qs);
    pcVar5 = QServ::getCommandDesc(&qs,cid);
    sendf(iVar3,1,"ris",0x23,pcVar5);
  }
  return;
}

Assistant:

QSERV_CALLBACK forcespectator_cmd(p) {
        bool usage = false;
        int cn = -1;
        if(CMD_SA) {
            cn = atoi(args[1]);
            if(cn >= 0 && cn <= 1000) {
                //if(!isalpha(cn)) {
                    forcespectatorprocess:
                    clientinfo *ci = qs.getClient(cn);

                    if(ci != NULL) {
                        if(ci->connected) {
                                if(cn!=CMD_SENDER && cn >= 0 && cn <= 1000 && ci != NULL && ci->connected && args[1] != NULL) {
                                clientinfo *ci = qs.getClient(cn);
                                forcespectator(ci);
                        }

                        }
                    } else {
                        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Player not connected");
                    }
                /*} else {
                    usage = true;
                }*/
            } else {
                usage = true;
            }
        } else {
            cn = CMD_SENDER;
            goto forcespectatorprocess;
        }

        if(usage) sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
    }